

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11.hpp
# Opt level: O2

void __thiscall
helics::helicsCLI11App::addTypeOption(helicsCLI11App *this,bool includeEnvironmentVariable)

{
  App *pAVar1;
  Option *pOVar2;
  CoreType type;
  allocator<char> local_13a;
  allocator<char> local_139;
  _Any_data local_138;
  code *local_128;
  code *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"network type",(allocator<char> *)local_138._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"",(allocator<char> *)&local_118);
  pAVar1 = &CLI::App::add_option_group<CLI::Option_group>(&this->super_App,&local_58,&local_78)->
            super_App;
  pAVar1 = CLI::App::immediate_callback(pAVar1,true);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"--coretype,-t",&local_139)
  ;
  local_138._8_8_ = 0;
  local_120 = CLI::std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/../core/helicsCLI11.hpp:180:19)>
              ::_M_invoke;
  local_128 = CLI::std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/../core/helicsCLI11.hpp:180:19)>
              ::_M_manager;
  local_138._M_unused._M_object = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"type of the core to connect to",&local_13a);
  pOVar2 = CLI::App::add_option_function<std::__cxx11::string>
                     (pAVar1,&local_98,
                      (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)&local_138,&local_b8);
  helics::core::to_string_abi_cxx11_(&local_f8,(core *)(ulong)this->coreType,type);
  std::operator+(&local_118,"(",&local_f8);
  std::operator+(&local_d8,&local_118,")");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar2->default_str_,&local_d8);
  pOVar2 = CLI::Option::ignore_case<CLI::App>(pOVar2,true);
  pOVar2 = CLI::Option::ignore_underscore<CLI::App>(pOVar2,true);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_b8);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_138);
  std::__cxx11::string::~string((string *)&local_98);
  if (includeEnvironmentVariable) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"HELICS_CORE_TYPE",(allocator<char> *)local_138._M_pod_data);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&pOVar2->envname_,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void addTypeOption(bool includeEnvironmentVariable = true)
    {
        auto* og = add_option_group("network type")->immediate_callback();
        auto* typeOption =
            og->add_option_function<std::string>(
                  "--coretype,-t",
                  [this](const std::string& val) {
                      coreType = coreTypeFromString(val);
                      if (coreType == CoreType::UNRECOGNIZED) {
                          throw CLI::ValidationError(val + " is NOT a recognized core type");
                      }
                  },
                  "type of the core to connect to")
                ->default_str("(" + to_string(coreType) + ")")
                ->ignore_case()
                ->ignore_underscore();
        if (includeEnvironmentVariable) {
            typeOption->envname("HELICS_CORE_TYPE");
        }
    }